

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.hpp
# Opt level: O3

void __thiscall diy::FileStorage::remove_file(FileStorage *this,FileRecord *fr)

{
  size_t sVar1;
  unique_lock<tthread::fast_mutex> local_28;
  
  remove((fr->name)._M_dataplus._M_p);
  sVar1 = fr->size;
  local_28._M_device = &(this->current_size_).m_;
  local_28._M_owns = false;
  std::unique_lock<tthread::fast_mutex>::lock(&local_28);
  (this->current_size_).x_ = (this->current_size_).x_ - sVar1;
  if (local_28._M_device != (fast_mutex *)0x0) {
    LOCK();
    (local_28._M_device)->mLock = 0;
    UNLOCK();
  }
  return;
}

Assistant:

void          remove_file(const FileRecord& fr)
      {
        io::utils::remove(fr.name);
        (*current_size_.access()) -= fr.size;
      }